

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O2

void __thiscall asl::Var::Var(Var *this,uint y)

{
  Type TVar1;
  
  if ((int)y < 0) {
    (this->field_1)._d = (double)y;
    TVar1 = NUMBER;
  }
  else {
    (this->field_1)._i = y;
    TVar1 = INT;
  }
  this->_type = TVar1;
  return;
}

Assistant:

Var::Var(unsigned y)
{
	if (y < 2147483648u) {
		_type = INT;
		_i = (int)y;
	}
	else {
		_type = NUMBER;
		_d = (double)y;
	}
}